

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O0

IntVect amrex::indexFromValue<amrex::FArrayBox,void>
                  (FabArray<amrex::FArrayBox> *mf,int comp,IntVect *nghost,
                  value_type_conflict1 value)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int in_ESI;
  double in_XMM0_Qa;
  IntVect IVar4;
  bool old;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *fab;
  Box *bx;
  MFIter mfi;
  IntVect priv_loc;
  bool f;
  IntVect loc;
  MFIter *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  undefined8 in_stack_fffffffffffffd00;
  undefined1 do_tiling_;
  long *plVar5;
  FabArrayBase *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  MFIter *in_stack_fffffffffffffd20;
  int local_2cc;
  int iStack_2c8;
  IntVect local_2c0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  undefined8 local_2a8;
  int local_2a0;
  undefined8 local_294;
  int local_28c;
  undefined8 local_288;
  int local_280;
  undefined8 local_278;
  int local_270;
  long local_268 [8];
  long *local_228;
  undefined8 local_21c [3];
  undefined8 *local_200;
  MFIter local_1f8;
  int local_198 [2];
  int local_190;
  int local_188;
  int iStack_184;
  int local_180;
  byte local_179;
  double local_178;
  int local_164;
  IntVect local_154;
  undefined8 local_148;
  int local_140;
  undefined8 *local_138;
  undefined4 local_12c;
  undefined4 uStack_128;
  int local_124;
  undefined8 local_120;
  int local_118;
  undefined8 *local_110;
  undefined4 local_104;
  undefined4 uStack_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  long *local_e8;
  undefined4 local_dc;
  undefined4 *local_d8;
  undefined4 local_cc;
  undefined4 *local_c8;
  undefined4 local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  undefined8 *local_a8;
  undefined4 local_9c;
  undefined8 *local_98;
  undefined4 local_8c;
  undefined8 *local_88;
  IntVect local_6c;
  int local_60 [2];
  int local_58;
  IntVect local_4c [6];
  undefined8 uVar6;
  int iVar7;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffd00 >> 0x38);
  local_178 = in_XMM0_Qa;
  local_164 = in_ESI;
  IntVect::IntVect(&local_154);
  local_179 = 0;
  iVar3 = std::numeric_limits<int>::lowest();
  IntVect::IntVect(local_4c,iVar3);
  local_58 = local_4c[0].vect[2];
  local_60[0] = local_4c[0].vect[0];
  local_60[1] = local_4c[0].vect[1];
  local_190 = local_4c[0].vect[2];
  local_198[0] = local_4c[0].vect[0];
  local_198[1] = local_4c[0].vect[1];
  local_188 = local_4c[0].vect[0];
  iStack_184 = local_4c[0].vect[1];
  local_180 = local_4c[0].vect[2];
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 in_stack_fffffffffffffd08,(bool)do_tiling_);
  while (bVar2 = MFIter::isValid(&local_1f8), bVar2) {
    MFIter::growntilebox
              (in_stack_fffffffffffffd20,
               (IntVect *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
    plVar5 = local_268;
    local_200 = local_21c;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
               in_stack_fffffffffffffce0);
    local_138 = local_200;
    local_88 = local_200;
    local_8c = 0;
    local_12c = *(undefined4 *)local_200;
    local_98 = local_200;
    local_9c = 1;
    uStack_128 = *(undefined4 *)((long)local_200 + 4);
    local_288 = *local_200;
    local_a8 = local_200;
    local_ac = 2;
    local_2ac = *(int *)(local_200 + 1);
    local_110 = local_200;
    local_b8 = (undefined8 *)((long)local_200 + 0xc);
    local_bc = 0;
    local_104 = *(undefined4 *)local_b8;
    local_c8 = (undefined4 *)((long)local_200 + 0xc);
    local_cc = 1;
    uStack_100 = *(undefined4 *)(local_200 + 2);
    local_2a8 = *local_b8;
    local_d8 = (undefined4 *)((long)local_200 + 0xc);
    local_dc = 2;
    local_2a0 = *(int *)((long)local_200 + 0x14);
    local_294 = local_2a8;
    local_28c = local_2a0;
    local_280 = local_2ac;
    local_278 = local_288;
    local_270 = local_2ac;
    local_228 = plVar5;
    local_148 = local_288;
    local_140 = local_2ac;
    local_124 = local_2ac;
    local_120 = local_2a8;
    local_118 = local_2a0;
    local_fc = local_2a0;
    for (; local_2ac <= local_28c; local_2ac = local_2ac + 1) {
      for (local_2b0 = local_278._4_4_; local_2b0 <= local_294._4_4_; local_2b0 = local_2b0 + 1) {
        for (local_2b4 = (int)local_278; local_2b4 <= (int)local_294; local_2b4 = local_2b4 + 1) {
          local_e8 = local_228;
          local_ec = local_2b4;
          local_f0 = local_2b0;
          local_f4 = local_2ac;
          local_f8 = local_164;
          dVar1 = *(double *)
                   (*local_228 +
                   ((long)(local_2b4 - (int)local_228[4]) +
                    (long)(local_2b0 - *(int *)((long)local_228 + 0x24)) * local_228[1] +
                    (long)(local_2ac - (int)local_228[5]) * local_228[2] +
                   (long)local_164 * local_228[3]) * 8);
          if ((dVar1 == local_178) && (!NAN(dVar1) && !NAN(local_178))) {
            IntVect::IntVect(&local_2c0,local_2b4,local_2b0,local_2ac);
            local_188 = local_2c0.vect[0];
            iStack_184 = local_2c0.vect[1];
            local_180 = local_2c0.vect[2];
          }
        }
      }
    }
    MFIter::operator++(&local_1f8);
  }
  MFIter::~MFIter(in_stack_fffffffffffffce0);
  iVar3 = std::numeric_limits<int>::lowest();
  IntVect::IntVect(&local_6c,iVar3);
  local_2cc = local_6c.vect[0];
  bVar2 = false;
  if (local_2cc < local_188) {
    iStack_2c8 = local_6c.vect[1];
    bVar2 = false;
    if (iStack_2c8 < iStack_184) {
      bVar2 = local_6c.vect[2] < local_180;
    }
  }
  if ((bVar2) && ((local_179 & 1) == 0)) {
    local_154.vect[0] = local_188;
    local_154.vect[1] = iStack_184;
    local_154.vect[2] = local_180;
  }
  IVar4.vect[0] = local_154.vect[0];
  uVar6._4_4_ = local_154.vect[1];
  register0x00000010 = local_154.vect[2];
  return (IntVect)IVar4.vect;
}

Assistant:

IntVect
indexFromValue (FabArray<FAB> const& mf, int comp, IntVect const& nghost,
                typename FAB::value_type value)
{
    IntVect loc;

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion())
    {
        amrex::Gpu::Buffer<int> aa({0,AMREX_D_DECL(0,0,0)});
        int* p = aa.data();
        // This is a device ptr to 1+AMREX_SPACEDIM int zeros.
        // The first is used as an atomic bool and the others for intvect.
        if (mf.isFusingCandidate()) {
            auto const& ma = mf.const_arrays();
            ParallelFor(mf, nghost, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                int* flag = p;
                if (*flag == 0) {
                    if (ma[box_no](i,j,k,comp) == value) {
                        if (Gpu::Atomic::Exch(flag,1) == 0) {
                            AMREX_D_TERM(p[1] = i;,
                                         p[2] = j;,
                                         p[3] = k;);
                        }
                    }
                }
            });
        } else {
            for (MFIter mfi(mf,MFItInfo().SetDeviceSync(false)); mfi.isValid(); ++mfi) {
                const Box& bx = amrex::grow(mfi.validbox(), nghost);
                auto const& arr = mf.const_array(mfi);
                amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    int* flag = p;
                    if (*flag == 0) {
                        if (arr(i,j,k,comp) == value) {
                            if (Gpu::Atomic::Exch(flag,1) == 0) {
                                AMREX_D_TERM(p[1] = i;,
                                             p[2] = j;,
                                             p[3] = k;);
                            }
                        }
                    }
                });
            }
        }
        int const* tmp = aa.copyToHost();
        AMREX_D_TERM(loc[0] = tmp[1];,
                     loc[1] = tmp[2];,
                     loc[2] = tmp[3];);
    }
    else
#endif
    {
        bool f = false;
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        {
            IntVect priv_loc = IntVect::TheMinVector();
            for (MFIter mfi(mf,true); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox(nghost);
                auto const& fab = mf.const_array(mfi);
                AMREX_LOOP_3D(bx, i, j, k,
                {
                    if (fab(i,j,k,comp) == value) priv_loc = IntVect(AMREX_D_DECL(i,j,k));
                });
            }

            if (priv_loc.allGT(IntVect::TheMinVector())) {
                bool old;
// we should be able to test on _OPENMP < 201107 for capture (version 3.1)
// but we must work around a bug in gcc < 4.9
// And, with NVHPC 21.9, we see an ICE with the atomic capture (NV bug: #3390723)
#if defined(AMREX_USE_OMP) && defined(_OPENMP) && (_OPENMP < 201307 || defined(__NVCOMPILER)) // OpenMP 4.0
#pragma omp critical (amrex_indexfromvalue)
#elif defined(AMREX_USE_OMP)
#pragma omp atomic capture
#endif
                {
                    old = f;
                    f = true;
                }

                if (old == false) loc = priv_loc;
            }
        }
    }

    return loc;
}